

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  Mat local_78;
  
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->q_weight_data;
  if (pMVar1 != &local_78) {
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + 1;
      UNLOCK();
    }
    piVar2 = (this->q_weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->q_weight_data).data;
        pAVar4 = (this->q_weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->q_weight_data).cstep = 0;
    *(undefined8 *)((long)&(this->q_weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->q_weight_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->q_weight_data).refcount = (int *)0x0;
    (this->q_weight_data).dims = 0;
    (this->q_weight_data).w = 0;
    (this->q_weight_data).h = 0;
    (this->q_weight_data).d = 0;
    (this->q_weight_data).c = 0;
    (this->q_weight_data).data = local_78.data;
    (this->q_weight_data).refcount = local_78.refcount;
    (this->q_weight_data).elemsize = local_78.elemsize;
    (this->q_weight_data).elempack = local_78.elempack;
    (this->q_weight_data).allocator = local_78.allocator;
    (this->q_weight_data).dims = local_78.dims;
    (this->q_weight_data).w = local_78.w;
    (this->q_weight_data).h = local_78.h;
    (this->q_weight_data).d = local_78.d;
    (this->q_weight_data).c = local_78.c;
    (this->q_weight_data).cstep = local_78.cstep;
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->q_weight_data).c * (this->q_weight_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
    pMVar1 = &this->q_bias_data;
    if (pMVar1 != &local_78) {
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + 1;
        UNLOCK();
      }
      piVar2 = (this->q_bias_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->q_bias_data).data;
          pAVar4 = (this->q_bias_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->q_bias_data).cstep = 0;
      *(undefined8 *)((long)&(this->q_bias_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->q_bias_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->q_bias_data).refcount = (int *)0x0;
      (this->q_bias_data).dims = 0;
      (this->q_bias_data).w = 0;
      (this->q_bias_data).h = 0;
      (this->q_bias_data).d = 0;
      (this->q_bias_data).c = 0;
      (this->q_bias_data).data = local_78.data;
      (this->q_bias_data).refcount = local_78.refcount;
      (this->q_bias_data).elemsize = local_78.elemsize;
      (this->q_bias_data).elempack = local_78.elempack;
      (this->q_bias_data).allocator = local_78.allocator;
      (this->q_bias_data).dims = local_78.dims;
      (this->q_bias_data).w = local_78.w;
      (this->q_bias_data).h = local_78.h;
      (this->q_bias_data).d = local_78.d;
      (this->q_bias_data).c = local_78.c;
      (this->q_bias_data).cstep = local_78.cstep;
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) &&
       ((long)(this->q_bias_data).c * (this->q_bias_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
      pMVar1 = &this->k_weight_data;
      if (pMVar1 != &local_78) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar2 = (this->k_weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->k_weight_data).data;
            pAVar4 = (this->k_weight_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->k_weight_data).cstep = 0;
        *(undefined8 *)((long)&(this->k_weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->k_weight_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->k_weight_data).refcount = (int *)0x0;
        (this->k_weight_data).dims = 0;
        (this->k_weight_data).w = 0;
        (this->k_weight_data).h = 0;
        (this->k_weight_data).d = 0;
        (this->k_weight_data).c = 0;
        (this->k_weight_data).data = local_78.data;
        (this->k_weight_data).refcount = local_78.refcount;
        (this->k_weight_data).elemsize = local_78.elemsize;
        (this->k_weight_data).elempack = local_78.elempack;
        (this->k_weight_data).allocator = local_78.allocator;
        (this->k_weight_data).dims = local_78.dims;
        (this->k_weight_data).w = local_78.w;
        (this->k_weight_data).h = local_78.h;
        (this->k_weight_data).d = local_78.d;
        (this->k_weight_data).c = local_78.c;
        (this->k_weight_data).cstep = local_78.cstep;
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar1->data != (void *)0x0) &&
         ((long)(this->k_weight_data).c * (this->k_weight_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
        pMVar1 = &this->k_bias_data;
        if (pMVar1 != &local_78) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar2 = (this->k_bias_data).refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar3 = (this->k_bias_data).data;
              pAVar4 = (this->k_bias_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->k_bias_data).cstep = 0;
          *(undefined8 *)((long)&(this->k_bias_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->k_bias_data).elemsize + 4) = 0;
          pMVar1->data = (void *)0x0;
          (this->k_bias_data).refcount = (int *)0x0;
          (this->k_bias_data).dims = 0;
          (this->k_bias_data).w = 0;
          (this->k_bias_data).h = 0;
          (this->k_bias_data).d = 0;
          (this->k_bias_data).c = 0;
          (this->k_bias_data).data = local_78.data;
          (this->k_bias_data).refcount = local_78.refcount;
          (this->k_bias_data).elemsize = local_78.elemsize;
          (this->k_bias_data).elempack = local_78.elempack;
          (this->k_bias_data).allocator = local_78.allocator;
          (this->k_bias_data).dims = local_78.dims;
          (this->k_bias_data).w = local_78.w;
          (this->k_bias_data).h = local_78.h;
          (this->k_bias_data).d = local_78.d;
          (this->k_bias_data).c = local_78.c;
          (this->k_bias_data).cstep = local_78.cstep;
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar1->data != (void *)0x0) &&
           ((long)(this->k_bias_data).c * (this->k_bias_data).cstep != 0)) {
          (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
          pMVar1 = &this->v_weight_data;
          if (pMVar1 != &local_78) {
            if (local_78.refcount != (int *)0x0) {
              LOCK();
              *local_78.refcount = *local_78.refcount + 1;
              UNLOCK();
            }
            piVar2 = (this->v_weight_data).refcount;
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                pvVar3 = (this->v_weight_data).data;
                pAVar4 = (this->v_weight_data).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            (this->v_weight_data).cstep = 0;
            *(undefined8 *)((long)&(this->v_weight_data).refcount + 4) = 0;
            *(undefined8 *)((long)&(this->v_weight_data).elemsize + 4) = 0;
            pMVar1->data = (void *)0x0;
            (this->v_weight_data).refcount = (int *)0x0;
            (this->v_weight_data).dims = 0;
            (this->v_weight_data).w = 0;
            (this->v_weight_data).h = 0;
            (this->v_weight_data).d = 0;
            (this->v_weight_data).c = 0;
            (this->v_weight_data).data = local_78.data;
            (this->v_weight_data).refcount = local_78.refcount;
            (this->v_weight_data).elemsize = local_78.elemsize;
            (this->v_weight_data).elempack = local_78.elempack;
            (this->v_weight_data).allocator = local_78.allocator;
            (this->v_weight_data).dims = local_78.dims;
            (this->v_weight_data).w = local_78.w;
            (this->v_weight_data).h = local_78.h;
            (this->v_weight_data).d = local_78.d;
            (this->v_weight_data).c = local_78.c;
            (this->v_weight_data).cstep = local_78.cstep;
          }
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + -1;
            UNLOCK();
            if (*local_78.refcount == 0) {
              if (local_78.allocator == (Allocator *)0x0) {
                if (local_78.data != (void *)0x0) {
                  free(local_78.data);
                }
              }
              else {
                (*(local_78.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if ((pMVar1->data != (void *)0x0) &&
             ((long)(this->v_weight_data).c * (this->v_weight_data).cstep != 0)) {
            (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim,1);
            pMVar1 = &this->v_bias_data;
            if (pMVar1 != &local_78) {
              if (local_78.refcount != (int *)0x0) {
                LOCK();
                *local_78.refcount = *local_78.refcount + 1;
                UNLOCK();
              }
              piVar2 = (this->v_bias_data).refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar3 = (this->v_bias_data).data;
                  pAVar4 = (this->v_bias_data).allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar3 != (void *)0x0) {
                      free(pvVar3);
                    }
                  }
                  else {
                    (*pAVar4->_vptr_Allocator[3])();
                  }
                }
              }
              (this->v_bias_data).cstep = 0;
              *(undefined8 *)((long)&(this->v_bias_data).refcount + 4) = 0;
              *(undefined8 *)((long)&(this->v_bias_data).elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              (this->v_bias_data).refcount = (int *)0x0;
              (this->v_bias_data).dims = 0;
              (this->v_bias_data).w = 0;
              (this->v_bias_data).h = 0;
              (this->v_bias_data).d = 0;
              (this->v_bias_data).c = 0;
              (this->v_bias_data).data = local_78.data;
              (this->v_bias_data).refcount = local_78.refcount;
              (this->v_bias_data).elemsize = local_78.elemsize;
              (this->v_bias_data).elempack = local_78.elempack;
              (this->v_bias_data).allocator = local_78.allocator;
              (this->v_bias_data).dims = local_78.dims;
              (this->v_bias_data).w = local_78.w;
              (this->v_bias_data).h = local_78.h;
              (this->v_bias_data).d = local_78.d;
              (this->v_bias_data).c = local_78.c;
              (this->v_bias_data).cstep = local_78.cstep;
            }
            if (local_78.refcount != (int *)0x0) {
              LOCK();
              *local_78.refcount = *local_78.refcount + -1;
              UNLOCK();
              if (*local_78.refcount == 0) {
                if (local_78.allocator == (Allocator *)0x0) {
                  if (local_78.data != (void *)0x0) {
                    free(local_78.data);
                  }
                }
                else {
                  (*(local_78.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if ((pMVar1->data != (void *)0x0) &&
               ((long)(this->v_bias_data).c * (this->v_bias_data).cstep != 0)) {
              (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
              Mat::operator=(&this->out_weight_data,&local_78);
              Mat::~Mat(&local_78);
              if (((this->out_weight_data).data != (void *)0x0) &&
                 ((long)(this->out_weight_data).c * (this->out_weight_data).cstep != 0)) {
                (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->embed_dim);
                Mat::operator=(&this->out_bias_data,&local_78);
                Mat::~Mat(&local_78);
                if (((this->out_bias_data).data != (void *)0x0) &&
                   (iVar5 = -100, (long)(this->out_bias_data).c * (this->out_bias_data).cstep != 0))
                {
                  iVar5 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}